

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_codemps(opj_mqc_t *mqc)

{
  opj_mqc_t *mqc_local;
  
  mqc->a = mqc->a - (*mqc->curctx)->qeval;
  if ((mqc->a & 0x8000) == 0) {
    if (mqc->a < (*mqc->curctx)->qeval) {
      mqc->a = (*mqc->curctx)->qeval;
    }
    else {
      mqc->c = (*mqc->curctx)->qeval + mqc->c;
    }
    *mqc->curctx = (*mqc->curctx)->nmps;
    opj_mqc_renorme(mqc);
  }
  else {
    mqc->c = (*mqc->curctx)->qeval + mqc->c;
  }
  return;
}

Assistant:

static void opj_mqc_codemps(opj_mqc_t *mqc)
{
    mqc->a -= (*mqc->curctx)->qeval;
    if ((mqc->a & 0x8000) == 0) {
        if (mqc->a < (*mqc->curctx)->qeval) {
            mqc->a = (*mqc->curctx)->qeval;
        } else {
            mqc->c += (*mqc->curctx)->qeval;
        }
        *mqc->curctx = (*mqc->curctx)->nmps;
        opj_mqc_renorme(mqc);
    } else {
        mqc->c += (*mqc->curctx)->qeval;
    }
}